

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTxOutReference::GetSerializeVsize
          (ConfidentialTxOutReference *this,bool is_blinded,int exponent,int minimum_bits,
          uint32_t *rangeproof_size,uint32_t input_asset_count)

{
  uint32_t uVar1;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t no_witness_size;
  uint32_t witness_size;
  uint32_t input_asset_count_local;
  uint32_t *rangeproof_size_local;
  int local_18;
  int minimum_bits_local;
  int exponent_local;
  bool is_blinded_local;
  ConfidentialTxOutReference *this_local;
  
  local_30 = 0;
  local_34 = 0;
  no_witness_size = input_asset_count;
  _witness_size = rangeproof_size;
  rangeproof_size_local._4_4_ = minimum_bits;
  local_18 = exponent;
  minimum_bits_local._3_1_ = is_blinded;
  _exponent_local = this;
  GetSerializeSize(this,is_blinded,&local_30,&local_34,exponent,minimum_bits,rangeproof_size,
                   input_asset_count);
  uVar1 = AbstractTransaction::GetVsizeFromSize(local_34,local_30);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxOutReference::GetSerializeVsize(
    bool is_blinded, int exponent, int minimum_bits, uint32_t *rangeproof_size,
    uint32_t input_asset_count) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  GetSerializeSize(
      is_blinded, &witness_size, &no_witness_size, exponent, minimum_bits,
      rangeproof_size, input_asset_count);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}